

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

_Bool get_ini_data(OpenJTalk *oj)

{
  double dVar1;
  uint uVar2;
  _Bool _Var3;
  ConfigScanner *sc;
  char *pcVar4;
  double temp_double;
  int temp_int;
  char *temp;
  double local_48;
  uint local_3c;
  char *local_38;
  
  if (g_ini_path[0] != '\0') {
    if (g_verbose) {
      console_message(anon_var_dwarf_5eb);
    }
    sc = config_load(g_ini_path);
    if (sc != (ConfigScanner *)0x0) {
      _Var3 = config_find_string(sc,G_SECTION_NAME,"voice_dir",&local_38);
      pcVar4 = local_38;
      if (_Var3) {
        if (oj->dn_voice_dir_path[0] == '\0') {
          if (g_verbose != false) {
            console_message_string(anon_var_dwarf_601,local_38);
          }
          set_config_voice_dir(oj,pcVar4);
        }
        else if (g_verbose != false) {
          console_message(anon_var_dwarf_618);
        }
      }
      _Var3 = config_find_string(sc,G_SECTION_NAME,"dic_dir",&local_38);
      if (_Var3) {
        if (oj->dn_dic_path[0] == '\0') {
          _Var3 = set_config_dic_dir(oj,local_38);
          if ((_Var3) || (g_verbose == false)) goto LAB_00149681;
          pcVar4 = anon_var_dwarf_62e;
        }
        else {
          if (g_verbose != true) goto LAB_00149681;
          pcVar4 = anon_var_dwarf_645;
        }
        console_message(pcVar4);
      }
LAB_00149681:
      _Var3 = config_find_string(sc,G_SECTION_NAME,"voice",&local_38);
      if (_Var3) {
        if (oj->fn_voice_path[0] == '\0') {
          if (g_verbose != false) {
            console_message_string(anon_var_dwarf_650,local_38);
          }
          set_config_voice(oj,local_38);
        }
        else if (g_verbose != false) {
          console_message(anon_var_dwarf_65b);
        }
      }
      pcVar4 = G_SECTION_NAME;
      _Var3 = config_find_integer(sc,G_SECTION_NAME,"sampling_frequency",(int *)&local_3c);
      uVar2 = local_3c;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_integer("config sampling_frequency: %d\n",local_3c);
        }
        openjtalk_setSamplingFrequency(oj,uVar2);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_integer(sc,pcVar4,"s",(int *)&local_3c);
      uVar2 = local_3c;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_integer("config s: %d\n",local_3c);
        }
        openjtalk_setSamplingFrequency(oj,uVar2);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_integer(sc,pcVar4,"fperiod",(int *)&local_3c);
      uVar2 = local_3c;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_integer("config fperiod: %d\n",local_3c);
        }
        openjtalk_setFperiod(oj,uVar2);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_integer(sc,pcVar4,"p",(int *)&local_3c);
      if (_Var3) {
        if (g_verbose == true) {
          console_message_integer("config p: %d\n",local_3c);
        }
        openjtalk_setFperiod(oj,local_3c);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"alpha",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config alpha: %f\n",local_48);
        }
        openjtalk_setAlpha(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"a",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config a: %f\n",local_48);
        }
        openjtalk_setAlpha(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"beta",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config beta: %f\n",local_48);
        }
        openjtalk_setBeta(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"b",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config b: %f\n",local_48);
        }
        openjtalk_setBeta(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"speed",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config speed: %f\n",local_48);
        }
        openjtalk_setSpeed(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"r",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config r: %f\n",local_48);
        }
        openjtalk_setSpeed(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"additional_half_tone",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config additional_half_tone: %f\n",local_48);
        }
        openjtalk_setAdditionalHalfTone(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"fm",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config fm: %f\n",local_48);
        }
        openjtalk_setAdditionalHalfTone(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"msd_threshold",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config msd_threshold: %f\n",local_48);
        }
        openjtalk_setMsdThreshold(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"u",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_integer("config u: %f\n",(int)local_48);
        }
        openjtalk_setMsdThreshold(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"gv_weight_for_spectrum",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config gv_weight_for_spectrum: %f\n",local_48);
        }
        openjtalk_setGvWeightForSpectrum(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"jm",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float(anon_var_dwarf_804,local_48);
        }
        openjtalk_setGvWeightForSpectrum(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"gv_weight_for_log_f0",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config gv_weight_for_log_f0: %f\n",local_48);
        }
        openjtalk_setGvWeightForLogF0(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"jf",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config jf: %f\n",local_48);
        }
        openjtalk_setGvWeightForLogF0(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"volume",&local_48);
      dVar1 = local_48;
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config volume: %f\n",local_48);
        }
        openjtalk_setVolume(oj,dVar1);
        pcVar4 = G_SECTION_NAME;
      }
      _Var3 = config_find_double(sc,pcVar4,"g",&local_48);
      if (_Var3) {
        if (g_verbose == true) {
          console_message_float("config g: %f\n",local_48);
        }
        openjtalk_setVolume(oj,local_48);
      }
      config_free(sc);
      if (g_verbose == true) {
        console_message(anon_var_dwarf_867);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool get_ini_data(OpenJTalk *oj)
{
	if (strlen(g_ini_path) == 0)
	{
		return false;
	}

	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　開始 *****\n");
	}

	ConfigScanner *sc = config_load(g_ini_path);
	if (sc == NULL)
	{
		return false;
	}

	char *temp;
	if (config_find_string(sc, G_SECTION_NAME, u8"voice_dir", &temp))
	{
		if (strlen(oj->dn_voice_dir_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice_dir： %s\n", temp);
			}
			set_config_voice_dir(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"dic_dir", &temp))
	{
		if (strlen(oj->dn_dic_path) == 0)
		{
			if (!set_config_dic_dir(oj, temp))
			{
				if (g_verbose)
				{
					console_message(u8"warning: 設定ファイルからの辞書ファイルの設定に失敗しました。\n");
				}
			}
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config dic_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"voice", &temp))
	{
		if (strlen(oj->fn_voice_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice： %s\n", temp);
			}
			set_config_voice(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice: 無視\n");
			}
		}
	}

	int temp_int;
	if (config_find_integer(sc, G_SECTION_NAME, u8"sampling_frequency", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config sampling_frequency: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"s", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config s: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"fperiod", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config fperiod: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"p", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config p: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}

	double temp_double;
	if (config_find_double(sc, G_SECTION_NAME, u8"alpha", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config alpha: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"a", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config a: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"beta", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config beta: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"b", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config b: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"speed", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config speed: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"r", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config r: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"additional_half_tone", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config additional_half_tone: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"fm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config fm: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"msd_threshold", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config msd_threshold: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"u", &temp_double))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config u: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_spectrum", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_spectrum: %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jm： %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_log_f0", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_log_f0: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jf", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jf: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"volume", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config volume: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"g", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config g: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	config_free(sc);
	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　終了 *****\n");
	}
	return true;
}